

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::readPixels(Functions *gl,Surface *screen)

{
  glReadPixelsFunc p_Var1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  PixelBufferAccess local_40;
  Surface *local_18;
  Surface *screen_local;
  Functions *gl_local;
  
  p_Var1 = gl->readPixels;
  local_18 = screen;
  screen_local = (Surface *)gl;
  iVar2 = tcu::Surface::getWidth(screen);
  iVar3 = tcu::Surface::getHeight(local_18);
  tcu::Surface::getAccess(&local_40,local_18);
  pvVar4 = tcu::PixelBufferAccess::getDataPtr(&local_40);
  (*p_Var1)(0,0,iVar2,iVar3,0x1908,0x1401,pvVar4);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface* screen)
{
	gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(),  GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
}